

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O1

tuple<int,_int>
check_paths_and_choose_tuple
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *mtrx)

{
  _Rb_tree_header *p_Var1;
  _Tuple_impl<0UL,_int,_int> _Var2;
  double *pdVar3;
  _Self __tmp;
  pointer pdVar4;
  pointer pvVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  double *pdVar9;
  _Rb_tree_color _Var10;
  ulong uVar11;
  ulong uVar12;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  double *pdVar13;
  long lVar14;
  ulong uVar15;
  undefined4 uVar16;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec1;
  pair<int,_int> pair;
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  tmp;
  double *local_e8;
  iterator iStack_e0;
  double *local_d8;
  double *local_c8;
  iterator iStack_c0;
  double *local_b8;
  _Base_ptr local_a8;
  _Tuple_impl<0UL,_int,_int> local_a0;
  long local_98;
  ulong local_90;
  double local_88;
  key_type local_80;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_b8 = (double *)0x0;
  local_c8 = (double *)0x0;
  iStack_c0._M_current = (double *)0x0;
  local_d8 = (double *)0x0;
  local_e8 = (double *)0x0;
  iStack_e0._M_current = (double *)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  (mtrx->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0 = (_Tuple_impl<0UL,_int,_int>)mtrx;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((in_RSI->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (in_RSI->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar15 = 0;
    do {
      pvVar5 = (in_RSI->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = pvVar5[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = uVar15;
      if (*(pointer *)
           ((long)&pvVar5[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) != pdVar4) {
        local_98 = uVar15 + 1;
        uVar11 = 0;
        local_90 = uVar15;
        do {
          if ((pdVar4[uVar11] == 0.0) && (!NAN(pdVar4[uVar11]))) {
            pvVar5 = (in_RSI->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pdVar4 = pvVar5[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (*(pointer *)
                 ((long)&pvVar5[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) != pdVar4) {
              lVar14 = 0;
              uVar12 = 0;
              do {
                if (iStack_c0._M_current == local_b8) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&local_c8,iStack_c0,
                             (double *)((long)pdVar4 + lVar14));
                }
                else {
                  *iStack_c0._M_current = *(double *)((long)pdVar4 + lVar14);
                  iStack_c0._M_current = iStack_c0._M_current + 1;
                }
                uVar12 = uVar12 + 1;
                pvVar5 = (in_RSI->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pdVar4 = pvVar5[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar14 = lVar14 + 8;
              } while (uVar12 < (ulong)((long)*(pointer *)
                                               ((long)&pvVar5[uVar15].
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                        (long)pdVar4 >> 3));
            }
            pdVar13 = local_c8 + uVar11 + 1;
            if (pdVar13 != iStack_c0._M_current) {
              memmove(local_c8 + uVar11,pdVar13,(long)iStack_c0._M_current - (long)pdVar13);
            }
            iStack_c0._M_current = iStack_c0._M_current + -1;
            lVar14 = (long)iStack_c0._M_current - (long)local_c8 >> 5;
            pdVar13 = local_c8;
            if (0 < lVar14) {
              pdVar13 = (double *)
                        (((long)iStack_c0._M_current - (long)local_c8 & 0xffffffffffffffe0U) +
                        (long)local_c8);
              lVar14 = lVar14 + 1;
              pdVar9 = local_c8 + 2;
              do {
                if (NAN(pdVar9[-2])) {
                  pdVar9 = pdVar9 + -2;
                  goto LAB_00102d38;
                }
                if (NAN(pdVar9[-1])) {
                  pdVar9 = pdVar9 + -1;
                  goto LAB_00102d38;
                }
                if (NAN(*pdVar9)) goto LAB_00102d38;
                if (NAN(pdVar9[1])) {
                  pdVar9 = pdVar9 + 1;
                  goto LAB_00102d38;
                }
                lVar14 = lVar14 + -1;
                pdVar9 = pdVar9 + 4;
              } while (1 < lVar14);
            }
            lVar14 = (long)iStack_c0._M_current - (long)pdVar13 >> 3;
            if (lVar14 == 1) {
LAB_00102d16:
              pdVar9 = pdVar13;
              if (!NAN(*pdVar13)) {
                pdVar9 = iStack_c0._M_current;
              }
            }
            else {
              pdVar9 = pdVar13;
              if (lVar14 == 2) {
LAB_00102d04:
                if (!NAN(*pdVar9)) {
                  pdVar13 = pdVar9 + 1;
                  goto LAB_00102d16;
                }
              }
              else {
                pdVar9 = iStack_c0._M_current;
                if ((lVar14 == 3) && (pdVar9 = pdVar13, !NAN(*pdVar13))) {
                  pdVar9 = pdVar13 + 1;
                  goto LAB_00102d04;
                }
              }
            }
LAB_00102d38:
            pdVar13 = pdVar9 + 1;
            if (pdVar13 != iStack_c0._M_current && pdVar9 != iStack_c0._M_current) {
              do {
                if (!NAN(*pdVar13)) {
                  *pdVar9 = *pdVar13;
                  pdVar9 = pdVar9 + 1;
                }
                pdVar13 = pdVar13 + 1;
              } while (pdVar13 != iStack_c0._M_current);
            }
            if ((pdVar9 != iStack_c0._M_current) && (iStack_c0._M_current != pdVar9)) {
              iStack_c0._M_current = pdVar9;
            }
            pdVar9 = local_c8 + 1;
            pdVar13 = local_c8;
            if (pdVar9 != iStack_c0._M_current && local_c8 != iStack_c0._M_current) {
              do {
                pdVar3 = pdVar9;
                if (*pdVar13 < *pdVar9 || *pdVar13 == *pdVar9) {
                  pdVar3 = pdVar13;
                }
                pdVar13 = pdVar3;
                pdVar9 = pdVar9 + 1;
              } while (pdVar9 != iStack_c0._M_current);
            }
            local_a8 = (_Base_ptr)*pdVar13;
            pvVar5 = (in_RSI->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((in_RSI->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
              lVar14 = 0;
              uVar12 = 0;
              do {
                pdVar13 = (double *)
                          (uVar11 * 8 +
                          *(long *)((long)&(pvVar5->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar14));
                if (iStack_e0._M_current == local_d8) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&local_e8,iStack_e0,pdVar13);
                }
                else {
                  *iStack_e0._M_current = *pdVar13;
                  iStack_e0._M_current = iStack_e0._M_current + 1;
                }
                uVar12 = uVar12 + 1;
                pvVar5 = (in_RSI->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar8 = ((long)(in_RSI->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                        -0x5555555555555555;
                lVar14 = lVar14 + 0x18;
              } while (uVar12 <= uVar8 && uVar8 - uVar12 != 0);
            }
            uVar12 = local_90;
            pdVar13 = local_e8 + local_90 + 1;
            if (pdVar13 != iStack_e0._M_current) {
              memmove(local_e8 + local_90,pdVar13,(long)iStack_e0._M_current - (long)pdVar13);
            }
            iStack_e0._M_current = iStack_e0._M_current + -1;
            lVar14 = (long)iStack_e0._M_current - (long)local_e8 >> 5;
            pdVar13 = local_e8;
            if (0 < lVar14) {
              pdVar13 = (double *)
                        (((long)iStack_e0._M_current - (long)local_e8 & 0xffffffffffffffe0U) +
                        (long)local_e8);
              lVar14 = lVar14 + 1;
              pdVar9 = local_e8 + 2;
              do {
                if (NAN(pdVar9[-2])) {
                  pdVar9 = pdVar9 + -2;
                  goto LAB_00102f3d;
                }
                if (NAN(pdVar9[-1])) {
                  pdVar9 = pdVar9 + -1;
                  goto LAB_00102f3d;
                }
                if (NAN(*pdVar9)) goto LAB_00102f3d;
                if (NAN(pdVar9[1])) {
                  pdVar9 = pdVar9 + 1;
                  goto LAB_00102f3d;
                }
                lVar14 = lVar14 + -1;
                pdVar9 = pdVar9 + 4;
              } while (1 < lVar14);
            }
            lVar14 = (long)iStack_e0._M_current - (long)pdVar13 >> 3;
            if (lVar14 == 1) {
LAB_00102f1b:
              pdVar9 = pdVar13;
              if (!NAN(*pdVar13)) {
                pdVar9 = iStack_e0._M_current;
              }
            }
            else {
              pdVar9 = pdVar13;
              if (lVar14 == 2) {
LAB_00102f09:
                if (!NAN(*pdVar9)) {
                  pdVar13 = pdVar9 + 1;
                  goto LAB_00102f1b;
                }
              }
              else {
                pdVar9 = iStack_e0._M_current;
                if ((lVar14 == 3) && (pdVar9 = pdVar13, !NAN(*pdVar13))) {
                  pdVar9 = pdVar13 + 1;
                  goto LAB_00102f09;
                }
              }
            }
LAB_00102f3d:
            pdVar13 = pdVar9 + 1;
            if (pdVar13 != iStack_e0._M_current && pdVar9 != iStack_e0._M_current) {
              do {
                if (!NAN(*pdVar13)) {
                  *pdVar9 = *pdVar13;
                  pdVar9 = pdVar9 + 1;
                }
                pdVar13 = pdVar13 + 1;
              } while (pdVar13 != iStack_e0._M_current);
            }
            if ((pdVar9 != iStack_e0._M_current) && (iStack_e0._M_current != pdVar9)) {
              iStack_e0._M_current = pdVar9;
            }
            pdVar9 = local_e8 + 1;
            pdVar13 = local_e8;
            if (pdVar9 != iStack_e0._M_current && local_e8 != iStack_e0._M_current) {
              do {
                pdVar3 = pdVar9;
                if (*pdVar13 < *pdVar9 || *pdVar13 == *pdVar9) {
                  pdVar3 = pdVar13;
                }
                pdVar13 = pdVar3;
                pdVar9 = pdVar9 + 1;
              } while (pdVar9 != iStack_e0._M_current);
            }
            local_88 = *pdVar13;
            local_80 = (key_type)((uVar11 << 0x20) + local_98 + 0x100000000);
            pmVar6 = std::
                     map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                     ::operator[]((map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                                   *)&local_78,&local_80);
            *pmVar6 = (double)local_a8 + local_88;
          }
          if (iStack_c0._M_current != local_c8) {
            iStack_c0._M_current = local_c8;
          }
          if (iStack_e0._M_current != local_e8) {
            iStack_e0._M_current = local_e8;
          }
          uVar11 = uVar11 + 1;
          pvVar5 = (in_RSI->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pdVar4 = pvVar5[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar5[uVar15].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pdVar4 >> 3));
      }
      uVar15 = uVar12 + 1;
      uVar12 = ((long)(in_RSI->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(in_RSI->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar15 <= uVar12 && uVar12 - uVar15 != 0);
  }
  _Var10 = _S_red;
  p_Var1 = &local_78._M_impl.super__Rb_tree_header;
  uVar16 = 0;
  if ((_Rb_tree_header *)local_78._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    _Var10 = _S_red;
    local_a8 = (_Base_ptr)0x0;
    uVar16 = 0;
    p_Var7 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((double)local_a8 < (double)p_Var7[1]._M_parent) {
        _Var10 = p_Var7[1]._M_color;
        uVar16 = *(undefined4 *)&p_Var7[1].field_0x4;
        local_a8 = p_Var7[1]._M_parent;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  _Var2 = local_a0;
  *(_Rb_tree_color *)((long)local_a0 + 4) = _Var10;
  *(undefined4 *)local_a0 = uVar16;
  reduce_rows_cols(&local_48,in_RSI,(tuple<int,_int> *)local_a0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&local_78);
  if (local_e8 != (double *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_c8 != (double *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  return (tuple<int,_int>)_Var2;
}

Assistant:

std::tuple<int,int> check_paths_and_choose_tuple(std::vector<std::vector<double>> &mtrx){

    std::vector<double> vec1,vec2;
    std::map<std::pair<int,int>,double> tmp;
    std::vector<std::tuple<int,int>> path;
    std::tuple<int,int> pas;

    double buff1,buff2;
    for (int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++) {
            if (mtrx[i][j] == 0) {
                for (int k = 0; k < mtrx[i].size(); k++) {
                    vec1.push_back(mtrx[i][k]);
                }
                vec1.erase(vec1.begin() + j);
                vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
                buff1 = *std::min_element(vec1.begin(),vec1.end());
                for(int l =0; l<mtrx.size(); l++){
                    vec2.push_back(mtrx[l][j]);
                }
                vec2.erase(vec2.begin()+ i);
                vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));
                buff2 = *std::min_element(vec2.begin(),vec2.end());
                auto pair = std::make_pair(i+1,j+1);
                tmp[pair] = buff1+buff2;
            }
            vec1.clear();
            vec2.clear();
        }
    }


    pas = findMaxValue_in_map(tmp);
    reduce_rows_cols(mtrx,pas);


    return pas;
}